

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_tsl::robin_map<const_void_*,_(anonymous_namespace)::WeakRef_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_(anonymous_namespace)::malloc_allocator<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>_>,_false,_tsl::rh::prime_growth_policy>::KeySelect,_tsl::robin_map<const_void_*,_(anonymous_namespace)::WeakRef_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_(anonymous_namespace)::malloc_allocator<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>_>,_false,_tsl::rh::prime_growth_policy>::ValueSelect,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_(anonymous_namespace)::malloc_allocator<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>_>,_false,_tsl::rh::prime_growth_policy>
::insert_value_impl(robin_hash<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_tsl::robin_map<const_void_*,_(anonymous_namespace)::WeakRef_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_(anonymous_namespace)::malloc_allocator<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>_>,_false,_tsl::rh::prime_growth_policy>::KeySelect,_tsl::robin_map<const_void_*,_(anonymous_namespace)::WeakRef_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_(anonymous_namespace)::malloc_allocator<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>_>,_false,_tsl::rh::prime_growth_policy>::ValueSelect,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_(anonymous_namespace)::malloc_allocator<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>_>,_false,_tsl::rh::prime_growth_policy>
                    *this,size_t ibucket,distance_type dist_from_ideal_bucket,
                   truncated_hash_type hash,value_type *value)

{
  distance_type dVar1;
  bool bVar2;
  distance_type dVar3;
  value_type *value_local;
  truncated_hash_type hash_local;
  distance_type dist_from_ideal_bucket_local;
  size_t ibucket_local;
  robin_hash<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_tsl::robin_map<const_void_*,_(anonymous_namespace)::WeakRef_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_(anonymous_namespace)::malloc_allocator<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>_>,_false,_tsl::rh::prime_growth_policy>::KeySelect,_tsl::robin_map<const_void_*,_(anonymous_namespace)::WeakRef_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_(anonymous_namespace)::malloc_allocator<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>_>,_false,_tsl::rh::prime_growth_policy>::ValueSelect,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_(anonymous_namespace)::malloc_allocator<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>_>,_false,_tsl::rh::prime_growth_policy>
  *this_local;
  
  value_local._0_4_ = hash;
  value_local._6_2_ = dist_from_ideal_bucket;
  _hash_local = ibucket;
  ibucket_local = (size_t)this;
  bucket_entry<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_false>::
  swap_with_value_in_bucket
            (this->m_buckets + ibucket,(distance_type *)((long)&value_local + 6),
             (truncated_hash_type *)&value_local,value);
  _hash_local = next_bucket<tsl::rh::prime_growth_policy,_nullptr>(this,_hash_local);
  while( true ) {
    value_local._6_2_ = value_local._6_2_ + 1;
    bVar2 = bucket_entry<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_false>::empty
                      (this->m_buckets + _hash_local);
    dVar1 = value_local._6_2_;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    dVar3 = bucket_entry<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_false>::
            dist_from_ideal_bucket(this->m_buckets + _hash_local);
    if (dVar3 < dVar1) {
      if (0x2000 < value_local._6_2_) {
        this->m_grow_on_next_insert = true;
      }
      bucket_entry<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_false>::
      swap_with_value_in_bucket
                (this->m_buckets + _hash_local,(distance_type *)((long)&value_local + 6),
                 (truncated_hash_type *)&value_local,value);
    }
    _hash_local = next_bucket<tsl::rh::prime_growth_policy,_nullptr>(this,_hash_local);
  }
  bucket_entry<std::pair<void_const*,(anonymous_namespace)::WeakRef*>,false>::
  set_value_of_empty_bucket<std::pair<void_const*,(anonymous_namespace)::WeakRef*>>
            ((bucket_entry<std::pair<void_const*,(anonymous_namespace)::WeakRef*>,false> *)
             (this->m_buckets + _hash_local),value_local._6_2_,(truncated_hash_type)value_local,
             value);
  return;
}

Assistant:

void insert_value_impl(std::size_t ibucket,
                         distance_type dist_from_ideal_bucket,
                         truncated_hash_type hash, value_type& value) {
    tsl_rh_assert(dist_from_ideal_bucket >
                  m_buckets[ibucket].dist_from_ideal_bucket());
    m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket, hash,
                                                 value);
    ibucket = next_bucket(ibucket);
    dist_from_ideal_bucket++;

    while (!m_buckets[ibucket].empty()) {
      if (dist_from_ideal_bucket >
          m_buckets[ibucket].dist_from_ideal_bucket()) {
        if (dist_from_ideal_bucket >
            bucket_entry::DIST_FROM_IDEAL_BUCKET_LIMIT) {
          /**
           * The number of probes is really high, rehash the map on the next
           * insert. Difficult to do now as rehash may throw an exception.
           */
          m_grow_on_next_insert = true;
        }

        m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket,
                                                     hash, value);
      }

      ibucket = next_bucket(ibucket);
      dist_from_ideal_bucket++;
    }

    m_buckets[ibucket].set_value_of_empty_bucket(dist_from_ideal_bucket, hash,
                                                 std::move(value));
  }